

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O2

LY_ERR lyd_diff_merge_r(lyd_node *src_diff,lyd_node *diff_parent,lyd_diff_cb diff_cb,void *cb_data,
                       ly_ht **dup_inst,uint16_t options,lyd_node **diff)

{
  uint16_t uVar1;
  ushort uVar2;
  lysc_node *plVar3;
  LY_ERR LVar4;
  uint uVar5;
  int iVar6;
  lyd_node *plVar7;
  lysc_node *plVar8;
  lyd_node *plVar9;
  size_t value_len;
  lyd_node *plVar10;
  lys_module *plVar11;
  lyd_meta *plVar12;
  lyd_meta *meta2;
  ushort uVar13;
  char *pcVar14;
  char *format;
  char *pcVar15;
  LY_ERR ret__;
  lyd_diff_cb p_Var16;
  lyd_diff_op lVar17;
  ly_ctx *plVar18;
  undefined8 uVar19;
  ulong uVar20;
  char *pcVar21;
  bool bVar22;
  lyd_node *diff_node;
  lyd_node *local_78;
  ly_ctx *local_70;
  lyd_node *local_68;
  lyd_diff_op cur_op;
  lyd_meta *local_58;
  lyd_diff_op src_op;
  lyd_diff_cb local_48;
  ly_ht *child_dup_inst;
  lyd_attr *local_38;
  
  diff_node = (lyd_node *)0x0;
  child_dup_inst = (ly_ht *)0x0;
  LVar4 = lyd_diff_get_op(src_diff,&src_op);
  if (LVar4 != LY_SUCCESS) {
    return LVar4;
  }
  local_78 = src_diff;
  local_48 = diff_cb;
  if (diff_parent == (lyd_node *)0x0) {
    plVar7 = *diff;
  }
  else {
    plVar7 = lyd_child_no_keys(diff_parent);
  }
  plVar10 = local_78;
  LVar4 = lyd_diff_find_match(plVar7,local_78,'\x01',dup_inst,&diff_node);
  if (LVar4 != LY_SUCCESS) {
    return LVar4;
  }
  if (diff_node == (lyd_node *)0x0) goto LAB_0011788b;
  LVar4 = lyd_diff_get_op(diff_node,&cur_op);
  plVar7 = diff_node;
  if (LVar4 != LY_SUCCESS) {
    return LVar4;
  }
  switch(src_op) {
  case LYD_DIFF_OP_CREATE:
    plVar8 = diff_node->schema;
    if (cur_op == LYD_DIFF_OP_CREATE) {
      if (plVar8 == (lysc_node *)0x0) goto LAB_00117307;
      if (plVar8->nodetype == 8) {
        if ((plVar8->flags & 1) == 0) goto LAB_0011788b;
LAB_00117103:
        plVar11 = plVar8->module;
        bVar22 = false;
        goto LAB_0011730f;
      }
      if ((plVar8->nodetype != 0x10) || ((plVar8->flags & 0x200) == 0)) goto LAB_00117103;
LAB_0011788b:
      p_Var16 = local_48;
      if ((diff_parent == (lyd_node *)0x0) || ((plVar10->flags & 8) == 0)) {
        LVar4 = lyd_dup_single(plVar10,(lyd_node_inner *)diff_parent,0x49,&diff_node);
        p_Var16 = local_48;
        if (LVar4 != LY_SUCCESS) {
          return LVar4;
        }
        if (diff_parent == (lyd_node *)0x0) {
          lyd_diff_insert_sibling(*diff,diff_node,diff);
        }
      }
      else {
        if (diff_parent->schema == (lysc_node *)0x0) {
          plVar11 = (lys_module *)&diff_parent[2].schema;
        }
        else {
          plVar11 = diff_parent->schema->module;
        }
        LVar4 = lyd_dup_single_to_ctx
                          (local_78,plVar11->ctx,(lyd_node_inner *)diff_parent,0x49,&diff_node);
        if (LVar4 != LY_SUCCESS) {
          return LVar4;
        }
      }
      LVar4 = lyd_diff_change_op(diff_node,src_op);
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
      plVar7 = diff_node;
      if (p_Var16 == (lyd_diff_cb)0x0) goto LAB_00117f70;
      LVar4 = (*p_Var16)((lyd_node *)0x0,diff_node,cb_data);
      plVar7 = diff_node;
joined_r0x00117935:
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
    }
    else {
      if (plVar8 != (lysc_node *)0x0) goto LAB_00117103;
LAB_00117307:
      plVar11 = (lys_module *)&diff_node[2].schema;
      bVar22 = true;
      plVar8 = (lysc_node *)0x0;
LAB_0011730f:
      plVar18 = plVar11->ctx;
      plVar3 = plVar10->schema;
      if (plVar3 == (lysc_node *)0x0) {
        uVar19 = 0x660;
        goto LAB_001175d1;
      }
      if (cur_op == LYD_DIFF_OP_DELETE) {
        uVar5 = diff_node->flags;
        uVar20 = (ulong)uVar5;
        if ((plVar3->nodetype & 0x18) == 0) {
          if ((plVar3->nodetype != 4) ||
             (((((options & 1) != 0 && (plVar8 = plVar3[1].prev, plVar8 != (lysc_node *)0x0)) &&
               (iVar6 = (**(code **)(plVar8->module->revision + 0x18))(plVar18,plVar8,plVar10 + 1),
               iVar6 == 0)) ||
              (LVar4 = lyd_compare_single(diff_node,plVar10,0), LVar4 == LY_SUCCESS))))
          goto LAB_00117688;
          local_68 = (lyd_node *)CONCAT44(local_68._4_4_,uVar5);
          if (diff_node->schema == (lysc_node *)0x0) {
            LVar4 = lyd_dup_single(plVar10,diff_node->parent,10,(lyd_node **)&local_58);
            plVar10 = local_78;
            if ((LVar4 == LY_SUCCESS) &&
               ((plVar7 = diff_node, diff_node->parent != (lyd_node_inner *)0x0 ||
                (LVar4 = lyd_insert_sibling(diff_node,(lyd_node *)local_58,diff), plVar7 = diff_node
                , plVar10 = local_78, LVar4 == LY_SUCCESS)))) {
              plVar12 = local_58;
              diff_node = (lyd_node *)local_58;
              pcVar15 = lyd_get_value(plVar7);
              LVar4 = lyd_new_meta(plVar18,(lyd_node *)plVar12,(lys_module *)0x0,"yang:orig-value",
                                   pcVar15,2,(lyd_meta **)0x0);
              lyd_free_tree(plVar7);
              plVar10 = local_78;
              if (LVar4 == LY_SUCCESS) {
                LVar4 = lyd_new_meta(plVar18,(lyd_node *)local_58,(lys_module *)0x0,"yang:operation"
                                     ,"replace",2,(lyd_meta **)0x0);
                plVar10 = local_78;
                goto LAB_00118450;
              }
            }
          }
          else {
            LVar4 = lyd_diff_change_op(diff_node,LYD_DIFF_OP_REPLACE);
            plVar7 = diff_node;
            if (LVar4 == LY_SUCCESS) {
              if (plVar10->schema == (lysc_node *)0x0) {
                plVar11 = (lys_module *)&local_78[2].schema;
              }
              else {
                plVar11 = plVar10->schema->module;
              }
              plVar18 = plVar11->ctx;
              pcVar15 = lyd_get_value(diff_node);
              LVar4 = lyd_new_meta(plVar18,plVar7,(lys_module *)0x0,"yang:orig-value",pcVar15,2,
                                   (lyd_meta **)0x0);
              plVar10 = local_78;
              plVar7 = diff_node;
              if (LVar4 != LY_SUCCESS) goto joined_r0x00117603;
              pcVar15 = lyd_get_value(local_78);
              LVar4 = lyd_change_term(plVar7,pcVar15);
LAB_00118450:
              uVar20 = (ulong)local_68 & 0xffffffff;
              if (LVar4 != LY_SUCCESS) goto joined_r0x00117603;
              goto LAB_00117698;
            }
          }
        }
        else {
          if ((plVar3->flags & 0x40) != 0) {
            if (bVar22) {
              __assert_fail("(*diff_match)->schema",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                            ,0x668,
                            "LY_ERR lyd_diff_merge_create(struct lyd_node **, struct lyd_node **, enum lyd_diff_op, const struct lyd_node *, uint16_t)"
                           );
            }
            pcVar21 = "yang:orig-value";
            local_68 = (lyd_node *)0x1b774e;
            pcVar15 = "yang:orig-position";
            plVar7 = (lyd_node *)"yang:value";
            if (plVar8->nodetype == 8) {
              if ((plVar8->flags & 1) != 0) goto LAB_00117aac;
            }
            else {
              if (plVar8->nodetype == 0x10) {
                if ((plVar8->flags & 0x200) != 0) goto LAB_00117ab2;
                pcVar21 = "yang:orig-key";
                plVar7 = (lyd_node *)"yang:key";
              }
LAB_00117aac:
              local_68 = plVar7;
              pcVar15 = pcVar21;
            }
LAB_00117ab2:
            local_70 = (ly_ctx *)lyd_find_meta(plVar10->meta,(lys_module *)0x0,(char *)local_68);
            if (local_70 == (ly_ctx *)0x0) {
              pcVar21 = lyd_path(plVar10,LYD_PATH_STD,(char *)0x0,0);
              pcVar14 = "Failed to find metadata \"%s\" for node \"%s\".";
              pcVar15 = pcVar21;
              plVar7 = local_68;
            }
            else {
              plVar12 = lyd_find_meta(diff_node->meta,(lys_module *)0x0,pcVar15);
              if (plVar12 != (lyd_meta *)0x0) {
                local_68 = (lyd_node *)CONCAT44(local_68._4_4_,uVar5);
                pcVar15 = lyd_get_meta_value((lyd_meta *)local_70);
                pcVar21 = lyd_get_meta_value(plVar12);
                iVar6 = strcmp(pcVar15,pcVar21);
                if (iVar6 == 0) {
                  LVar4 = lyd_diff_change_op(diff_node,LYD_DIFF_OP_NONE);
                  if (LVar4 == LY_SUCCESS) {
                    lyd_free_meta_single(plVar12);
                    uVar20 = (ulong)local_68 & 0xffffffff;
                    goto LAB_00117698;
                  }
                }
                else {
                  LVar4 = lyd_diff_change_op(diff_node,LYD_DIFF_OP_REPLACE);
                  if ((LVar4 == LY_SUCCESS) &&
                     (LVar4 = lyd_dup_meta_single((lyd_meta *)local_70,diff_node,(lyd_meta **)0x0),
                     plVar10 = local_78, plVar7 = diff_node, LVar4 == LY_SUCCESS)) {
                    do {
                      plVar9 = plVar7;
                      plVar7 = plVar9->next;
                      if (plVar7 == (lyd_node *)0x0) break;
                    } while (plVar7->schema == diff_node->schema);
                    uVar20 = (ulong)local_68 & 0xffffffff;
                    if (plVar9 != diff_node) {
                      LVar4 = lyd_insert_after(plVar9,diff_node);
                      goto LAB_00117690;
                    }
LAB_00117698:
                    if (diff_node->schema == (lysc_node *)0x0) {
                      __assert_fail("(*diff_match)->schema",
                                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                                    ,0x6bb,
                                    "LY_ERR lyd_diff_merge_create(struct lyd_node **, struct lyd_node **, enum lyd_diff_op, const struct lyd_node *, uint16_t)"
                                   );
                    }
                    if ((diff_node->schema->nodetype & 0xc) != 0) {
                      if (plVar10->schema == (lysc_node *)0x0) {
                        plVar11 = (lys_module *)&plVar10[2].schema;
                      }
                      else {
                        plVar11 = plVar10->schema->module;
                      }
                      pcVar15 = "true";
                      if ((uVar20 & 1) == 0) {
                        pcVar15 = "false";
                      }
                      LVar4 = lyd_new_meta(plVar11->ctx,diff_node,(lys_module *)0x0,
                                           "yang:orig-default",pcVar15,2,(lyd_meta **)0x0);
                      if (LVar4 != LY_SUCCESS) goto joined_r0x00117603;
                      uVar5 = diff_node->flags & 0xfffffffe;
                      diff_node->flags = uVar5;
                      diff_node->flags = plVar10->flags & 1 | uVar5;
                    }
                    for (plVar7 = lyd_child_no_keys(diff_node); plVar7 != (lyd_node *)0x0;
                        plVar7 = plVar7->next) {
                      LVar4 = lyd_diff_change_op(plVar7,LYD_DIFF_OP_DELETE);
                      if (LVar4 != LY_SUCCESS) goto joined_r0x00117603;
                    }
                    goto LAB_001181ba;
                  }
                }
                goto joined_r0x00117603;
              }
              local_78 = (lyd_node *)pcVar15;
              pcVar21 = lyd_path(diff_node,LYD_PATH_STD,(char *)0x0,0);
              pcVar14 = "Failed to find metadata \"%s\" for node \"%s\".";
              pcVar15 = pcVar21;
              plVar7 = local_78;
            }
LAB_00117bde:
            ly_log(plVar18,LY_LLERR,LY_EINVAL,pcVar14,plVar7,pcVar21);
            goto LAB_00117beb;
          }
LAB_00117688:
          LVar4 = lyd_diff_change_op(diff_node,LYD_DIFF_OP_NONE);
LAB_00117690:
          if (LVar4 == LY_SUCCESS) goto LAB_00117698;
        }
      }
      else {
        pcVar15 = lyd_path(diff_node,LYD_PATH_STD,(char *)0x0,0);
        if (plVar10->schema == (lysc_node *)0x0) {
          plVar11 = (lys_module *)&plVar10[2].schema;
        }
        else {
          plVar11 = plVar10->schema->module;
        }
        plVar18 = plVar11->ctx;
        pcVar14 = lyd_diff_op2str(cur_op);
        format = "Unable to merge operation \"%s\" with \"%s\" for node \"%s\".";
        pcVar21 = "create";
LAB_001176f8:
        ly_log(plVar18,LY_LLERR,LY_EINVAL,format,pcVar21,pcVar14);
LAB_00117beb:
        LVar4 = LY_EINVAL;
        free(pcVar15);
      }
joined_r0x00117603:
      if (LVar4 != LY_SUCCESS) goto LAB_00117e7a;
LAB_00117e89:
      if ((local_48 != (lyd_diff_cb)0x0) &&
         (LVar4 = (*local_48)(plVar10,diff_node,cb_data), LVar4 != LY_SUCCESS)) {
        return LVar4;
      }
      plVar7 = diff_node;
      plVar8 = plVar10->schema;
      if (plVar8 == (lysc_node *)0x0) {
LAB_00117f08:
        plVar10 = lyd_child_no_keys(plVar10);
        p_Var16 = local_48;
        for (; plVar10 != (lyd_node *)0x0; plVar10 = plVar10->next) {
          LVar4 = lyd_diff_merge_r(plVar10,plVar7,p_Var16,cb_data,&child_dup_inst,options,diff);
          if (LVar4 != LY_SUCCESS) goto LAB_00117f5c;
        }
        LVar4 = LY_SUCCESS;
LAB_00117f5c:
        lyd_dup_inst_free(child_dup_inst);
        goto joined_r0x00117935;
      }
      if (plVar8->nodetype == 8) {
        if ((plVar8->flags & 1) != 0) goto LAB_00117f08;
      }
      else if ((plVar8->nodetype != 0x10) || ((plVar8->flags & 0x200) == 0)) goto LAB_00117f08;
    }
LAB_00117f70:
    if (plVar7 == (lyd_node *)0x0) {
      __assert_fail("diff",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                    0x74c,"int lyd_diff_is_redundant(struct lyd_node *)");
    }
    plVar8 = plVar7->schema;
    if (plVar8 == (lysc_node *)0x0) {
LAB_00117fa3:
      plVar10 = lyd_child_no_keys(plVar7);
      bVar22 = plVar10 == (lyd_node *)0x0;
      plVar8 = plVar7->schema;
      if (plVar8 == (lysc_node *)0x0) {
        plVar11 = (lys_module *)&plVar7[2].schema;
        goto LAB_00117fc5;
      }
    }
    else if (plVar8->nodetype == 8) {
      bVar22 = true;
      if ((plVar8->flags & 1) != 0) goto LAB_00117fa3;
    }
    else if ((plVar8->nodetype != 0x10) || (bVar22 = true, (plVar8->flags & 0x200) == 0))
    goto LAB_00117fa3;
    plVar11 = plVar8->module;
LAB_00117fc5:
    plVar11 = ly_ctx_get_module_latest(plVar11->ctx,"yang");
    if (plVar11 == (lys_module *)0x0) {
      __assert_fail("mod",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                    0x755,"int lyd_diff_is_redundant(struct lyd_node *)");
    }
    LVar4 = lyd_diff_get_op(plVar7,(lyd_diff_op *)&local_58);
    if (LVar4 != LY_SUCCESS) {
      return LY_SUCCESS;
    }
    if ((int)local_58 == 3) {
      if (plVar7->schema != (lysc_node *)0x0) {
        if ((plVar7->schema->nodetype & 0xc) == 0) {
          if (!bVar22) {
            return LY_SUCCESS;
          }
        }
        else {
          plVar12 = lyd_find_meta(plVar7->meta,plVar11,"orig-default");
          if (plVar12 == (lyd_meta *)0x0) {
            __assert_fail("meta",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                          ,0x788,"int lyd_diff_is_redundant(struct lyd_node *)");
          }
          pcVar15 = lyd_get_meta_value(plVar12);
          iVar6 = strcmp(pcVar15,"true");
          if ((iVar6 != 0) || ((plVar7->flags & 1) == 0)) {
            iVar6 = strcmp(pcVar15,"false");
            if (iVar6 != 0) {
              return LY_SUCCESS;
            }
            if ((plVar7->flags & 1) != 0) {
              return LY_SUCCESS;
            }
          }
        }
      }
    }
    else {
      if ((int)local_58 != 2) {
        return LY_SUCCESS;
      }
      plVar8 = plVar7->schema;
      if (plVar8 == (lysc_node *)0x0) {
        return LY_SUCCESS;
      }
      uVar13 = plVar8->nodetype;
      if ((uVar13 & 0x18) == 0) {
        return LY_SUCCESS;
      }
      uVar2 = plVar8->flags;
      if ((uVar2 & 0x40) == 0) {
        return LY_SUCCESS;
      }
      pcVar21 = "position";
      pcVar15 = "orig-position";
      if (((uVar13 == 0x10 & (byte)(uVar2 >> 9) & 1) == 0) && ((uVar13 != 8 || ((uVar2 & 1) != 0))))
      {
        pcVar15 = "yang:orig-value";
        if (uVar13 == 0x10) {
          pcVar15 = "yang:orig-key";
        }
        pcVar15 = pcVar15 + 5;
        pcVar21 = "value";
        if (uVar13 == 0x10) {
          pcVar21 = "key";
        }
      }
      plVar12 = lyd_find_meta(plVar7->meta,plVar11,pcVar15);
      meta2 = lyd_find_meta(plVar7->meta,plVar11,pcVar21);
      if ((plVar12 == (lyd_meta *)0x0) || (meta2 == (lyd_meta *)0x0)) {
        __assert_fail("orig_val_meta && val_meta",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                      ,0x76a,"int lyd_diff_is_redundant(struct lyd_node *)");
      }
      LVar4 = lyd_compare_meta(plVar12,meta2);
      if (LVar4 != LY_SUCCESS) {
        return LY_SUCCESS;
      }
      lyd_free_meta_single(plVar12);
      lyd_free_meta_single(meta2);
      if (!bVar22) {
        lyd_diff_change_op(plVar7,LYD_DIFF_OP_NONE);
        return LY_SUCCESS;
      }
    }
    if (plVar7 == *diff) {
      *diff = (*diff)->next;
    }
    lyd_free_tree(plVar7);
    return LY_SUCCESS;
  case LYD_DIFF_OP_DELETE:
    if (diff_node->schema == (lysc_node *)0x0) {
      plVar11 = (lys_module *)&diff_node[2].schema;
    }
    else {
      plVar11 = diff_node->schema->module;
    }
    plVar18 = plVar11->ctx;
    LVar4 = lyd_compare_single(diff_node,plVar10,0);
    if (LVar4 != LY_SUCCESS) {
      if (plVar10->schema == (lysc_node *)0x0) {
        plVar11 = (lys_module *)&plVar10[2].schema;
      }
      else {
        plVar11 = plVar10->schema->module;
      }
      plVar18 = plVar11->ctx;
      uVar19 = 0x6e7;
LAB_001175d1:
      LVar4 = LY_EINT;
      ly_log(plVar18,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",uVar19)
      ;
      goto joined_r0x00117603;
    }
    local_70 = (ly_ctx *)CONCAT44(local_70._4_4_,cur_op);
    lVar17 = cur_op;
    if (cur_op != LYD_DIFF_OP_NONE) {
      if (cur_op == LYD_DIFF_OP_REPLACE) {
        uVar13 = plVar7->schema->nodetype;
        if ((uVar13 & 0x18) != 0) {
          uVar2 = plVar7->schema->flags;
          if ((uVar2 & 0x40) == 0) goto LAB_001184fb;
          pcVar15 = "position";
          if ((((uVar13 == 0x10 & (byte)(uVar2 >> 9) & 1) == 0) &&
              ((uVar13 != 8 || ((uVar2 & 1) != 0)))) && (pcVar15 = "value", uVar13 == 0x10)) {
            pcVar15 = "key";
          }
LAB_00117e57:
          lyd_diff_del_meta(plVar7,pcVar15);
          goto LAB_00117e5f;
        }
        if (uVar13 != 4) {
LAB_001184fb:
          __assert_fail("diff_match->schema->nodetype == LYS_LEAF",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                        ,0x6ff,
                        "LY_ERR lyd_diff_merge_delete(struct lyd_node *, enum lyd_diff_op, const struct lyd_node *)"
                       );
        }
        plVar12 = lyd_find_meta(plVar7->meta,(lys_module *)0x0,"yang:orig-value");
        if (plVar12 == (lyd_meta *)0x0) {
          pcVar14 = lyd_path(plVar7,LYD_PATH_STD,(char *)0x0,0);
          format = "Failed to find metadata \"%s\" for node \"%s\".";
          pcVar21 = "yang:orig-value";
          pcVar15 = pcVar14;
        }
        else {
          pcVar15 = lyd_get_meta_value(plVar12);
          LVar4 = lyd_change_term(plVar7,pcVar15);
          if (LVar4 == LY_SUCCESS) {
            local_58 = lyd_find_meta(plVar7->meta,(lys_module *)0x0,"yang:orig-default");
            if (local_58 == (lyd_meta *)0x0) {
              pcVar15 = lyd_path(plVar7,LYD_PATH_STD,(char *)0x0,0);
              LVar4 = LY_EINVAL;
              ly_log(plVar18,LY_LLERR,LY_EINVAL,"Failed to find metadata \"%s\" for node \"%s\".",
                     "yang:orig-default",pcVar15);
              free(pcVar15);
              plVar10 = local_78;
              goto joined_r0x00117603;
            }
            uVar5 = plVar7->flags;
            plVar7->flags = uVar5 & 0xfffffffe;
            if ((local_58->value).field_2.boolean != '\0') {
              plVar7->flags = uVar5 | 1;
            }
            lyd_free_meta_single(local_58);
            pcVar15 = "orig-value";
            plVar10 = local_78;
            lVar17 = (lyd_diff_op)local_70;
            goto LAB_00117e57;
          }
          pcVar21 = lyd_path(plVar7,LYD_PATH_STD,(char *)0x0,0);
          format = "Unexpected value of node \"%s\" in %s.";
          pcVar14 = "target diff";
          pcVar15 = pcVar21;
        }
        goto LAB_001176f8;
      }
      if (cur_op == LYD_DIFF_OP_CREATE) {
        LVar4 = lyd_diff_change_op(plVar7,LYD_DIFF_OP_NONE);
        if (LVar4 == LY_SUCCESS) {
          plVar8 = plVar7->schema;
          uVar13 = plVar8->nodetype;
          if ((uVar13 & 0xc) != 0) {
            if (plVar10->schema == (lysc_node *)0x0) {
              plVar11 = (lys_module *)&plVar10[2].schema;
            }
            else {
              plVar11 = plVar10->schema->module;
            }
            pcVar15 = "true";
            if ((plVar10->flags & 1) == 0) {
              pcVar15 = "false";
            }
            LVar4 = lyd_new_meta(plVar11->ctx,plVar7,(lys_module *)0x0,"yang:orig-default",pcVar15,2
                                 ,(lyd_meta **)0x0);
            goto LAB_00117e6a;
          }
          goto LAB_0011816f;
        }
        goto joined_r0x00117603;
      }
      pcVar15 = lyd_path(plVar7,LYD_PATH_STD,(char *)0x0,0);
      if (plVar7->schema == (lysc_node *)0x0) {
        plVar11 = (lys_module *)&plVar7[2].schema;
      }
      else {
        plVar11 = plVar7->schema->module;
      }
      plVar18 = plVar11->ctx;
      pcVar21 = lyd_diff_op2str((lyd_diff_op)local_70);
      pcVar14 = "Unable to merge operation \"%s\" with \"%s\" for node \"%s\".";
      plVar7 = (lyd_node *)"delete";
      goto LAB_00117bde;
    }
LAB_00117e5f:
    LVar4 = lyd_diff_change_op(plVar7,LYD_DIFF_OP_DELETE);
    cur_op = lVar17;
LAB_00117e6a:
    if (LVar4 != LY_SUCCESS) goto joined_r0x00117603;
    plVar8 = plVar7->schema;
    lVar17 = cur_op;
    if (plVar8 == (lysc_node *)0x0) {
LAB_001181c2:
      for (plVar7 = lyd_child_no_keys(plVar7); plVar7 != (lyd_node *)0x0; plVar7 = plVar7->next) {
        lyd_diff_find_meta(plVar7,"operation",&local_58,&local_38);
        if (local_38 == (lyd_attr *)0x0 && local_58 == (lyd_meta *)0x0) {
          plVar8 = plVar7->schema;
          if (plVar8 == (lysc_node *)0x0) {
            plVar9 = lyd_child(plVar10);
            LVar4 = lyd_find_sibling_opaq_next(plVar9,(char *)plVar7[1].schema,(lyd_node **)0x0);
          }
          else {
            uVar13 = plVar8->nodetype;
            plVar9 = lyd_child(plVar10);
            if ((uVar13 & 0x18) == 0) {
              LVar4 = lyd_find_sibling_val(plVar9,plVar8,(char *)0x0,0,(lyd_node **)0x0);
            }
            else {
              LVar4 = lyd_find_sibling_first(plVar9,plVar7,(lyd_node **)0x0);
            }
            lVar17 = (lyd_diff_op)local_70;
          }
          if ((LVar4 != LY_ENOTFOUND) &&
             ((LVar4 != LY_SUCCESS ||
              (LVar4 = lyd_diff_change_op(plVar7,lVar17), LVar4 != LY_SUCCESS))))
          goto joined_r0x00117603;
        }
      }
    }
    else {
      uVar13 = plVar8->nodetype;
LAB_0011816f:
      lVar17 = cur_op;
      if (uVar13 == 8) {
        if ((plVar8->flags & 1) != 0) goto LAB_001181c2;
      }
      else if ((uVar13 != 0x10) || ((plVar8->flags & 0x200) == 0)) goto LAB_001181c2;
    }
LAB_001181ba:
    LVar4 = LY_SUCCESS;
    goto joined_r0x00117603;
  case LYD_DIFF_OP_REPLACE:
    if (diff_node->schema == (lysc_node *)0x0) {
      plVar11 = (lys_module *)&diff_node[2].schema;
    }
    else {
      plVar11 = diff_node->schema->module;
    }
    local_70 = plVar11->ctx;
    plVar11 = ly_ctx_get_module_latest(local_70,"yang");
    if (plVar11 == (lys_module *)0x0) {
      __assert_fail("mod",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                    0x5d5,
                    "LY_ERR lyd_diff_merge_replace(struct lyd_node *, enum lyd_diff_op, const struct lyd_node *)"
                   );
    }
    if (cur_op == LYD_DIFF_OP_CREATE) {
LAB_001171f2:
      uVar13 = plVar7->schema->nodetype;
      if (uVar13 == 4) {
        LVar4 = lyd_compare_single(plVar7,plVar10,0);
        if (LVar4 != LY_SUCCESS) {
          pcVar15 = lyd_get_value(plVar10);
          LVar4 = lyd_change_term(plVar7,pcVar15);
          if (LVar4 == LY_SUCCESS) {
            if (cur_op == LYD_DIFF_OP_REPLACE) {
              plVar12 = lyd_find_meta(plVar7->meta,plVar11,"orig-value");
              if (plVar12 == (lyd_meta *)0x0) {
                pcVar15 = lyd_path(plVar7,LYD_PATH_STD,(char *)0x0,0);
                LVar4 = LY_EINVAL;
                ly_log(local_70,LY_LLERR,LY_EINVAL,"Failed to find metadata \"%s\" for node \"%s\"."
                       ,"orig-value",pcVar15);
                free(pcVar15);
                plVar10 = local_78;
                goto LAB_00117e7a;
              }
              pcVar15 = lyd_get_meta_value(plVar12);
              value_len = strlen(pcVar15);
              LVar4 = lyd_value_compare((lyd_node_term *)plVar7,pcVar15,value_len);
              plVar10 = local_78;
              if (LVar4 == LY_SUCCESS) {
                lyd_free_meta_single(plVar12);
                LVar4 = lyd_diff_change_op(plVar7,LYD_DIFF_OP_NONE);
                plVar10 = local_78;
                if (LVar4 != LY_SUCCESS) goto LAB_00117e7a;
              }
            }
            goto LAB_00117163;
          }
          if (plVar10->schema == (lysc_node *)0x0) {
            plVar11 = (lys_module *)&plVar10[2].schema;
          }
          else {
            plVar11 = plVar10->schema->module;
          }
          plVar18 = plVar11->ctx;
          uVar19 = 0x5f6;
LAB_0011829b:
          LVar4 = LY_EINT;
          ly_log(plVar18,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                 uVar19);
          goto LAB_00117e7a;
        }
LAB_0011784d:
        pcVar15 = lyd_path(plVar7,LYD_PATH_STD,(char *)0x0,0);
        pcVar14 = "Unexpected value of node \"%s\" in %s.";
        pcVar21 = "target diff";
        plVar18 = local_70;
        plVar9 = (lyd_node *)pcVar15;
        break;
      }
      if (uVar13 != 8) {
        if ((uVar13 == 0x60) || (uVar13 == 0x20)) {
          LVar4 = lyd_compare_single(plVar7,plVar10,0);
          if (LVar4 != LY_SUCCESS) {
            LVar4 = lyd_any_copy_value(plVar7,(lyd_any_value *)(plVar10 + 1),
                                       *(LYD_ANYDATA_VALUETYPE *)&plVar10[1].schema);
            goto joined_r0x00117603;
          }
          goto LAB_0011784d;
        }
        if (uVar13 != 0x10) {
          if (plVar10->schema == (lysc_node *)0x0) {
            plVar11 = (lys_module *)&plVar10[2].schema;
          }
          else {
            plVar11 = plVar10->schema->module;
          }
          plVar18 = plVar11->ctx;
          uVar19 = 0x616;
          goto LAB_0011829b;
        }
      }
      if (((uVar13 & 0x18) == 0) || (uVar2 = plVar7->schema->flags, (uVar2 & 0x40) == 0)) {
        __assert_fail("lysc_is_userordered(diff_match->schema)",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                      ,0x5df,
                      "LY_ERR lyd_diff_merge_replace(struct lyd_node *, enum lyd_diff_op, const struct lyd_node *)"
                     );
      }
      pcVar15 = "position";
      if (((uVar13 == 0x10 & (byte)(uVar2 >> 9) & 1) == 0) &&
         (((uVar13 != 8 || ((uVar2 & 1) != 0)) && (pcVar15 = "value", uVar13 == 0x10)))) {
        pcVar15 = "key";
      }
      lyd_diff_del_meta(plVar7,pcVar15);
      plVar12 = lyd_find_meta(plVar10->meta,plVar11,pcVar15);
      if (plVar12 != (lyd_meta *)0x0) {
        LVar4 = lyd_dup_meta_single(plVar12,plVar7,(lyd_meta **)0x0);
        goto joined_r0x00117603;
      }
    }
    else {
      if (cur_op != LYD_DIFF_OP_NONE) {
        if (cur_op != LYD_DIFF_OP_REPLACE) {
          plVar9 = (lyd_node *)lyd_path(plVar7,LYD_PATH_STD,(char *)0x0,0);
          pcVar21 = lyd_diff_op2str(cur_op);
          pcVar14 = "Unable to merge operation \"%s\" with \"%s\" for node \"%s\".";
          pcVar15 = "replace";
          plVar18 = local_70;
          break;
        }
        goto LAB_001171f2;
      }
      uVar1 = plVar7->schema->nodetype;
      if (uVar1 == 4) {
        LVar4 = lyd_diff_change_op(plVar7,LYD_DIFF_OP_REPLACE);
        if (LVar4 != LY_SUCCESS) goto LAB_00117e7a;
        pcVar15 = lyd_get_value(plVar10);
        LVar4 = lyd_change_term(plVar7,pcVar15);
        if (LVar4 == LY_SUCCESS) goto LAB_00117e89;
        if (plVar10->schema == (lysc_node *)0x0) {
          plVar11 = (lys_module *)&plVar10[2].schema;
        }
        else {
          plVar11 = plVar10->schema->module;
        }
        plVar18 = plVar11->ctx;
        uVar19 = 0x639;
        goto LAB_0011829b;
      }
      if (uVar1 != 0x10) {
        if (plVar10->schema == (lysc_node *)0x0) {
          plVar11 = (lys_module *)&plVar10[2].schema;
        }
        else {
          plVar11 = plVar10->schema->module;
        }
        plVar18 = plVar11->ctx;
        uVar19 = 0x63d;
        goto LAB_0011829b;
      }
      if ((plVar7->schema->flags & 0x40) == 0) {
        __assert_fail("lysc_is_userordered(diff_match->schema)",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                      ,0x61d,
                      "LY_ERR lyd_diff_merge_replace(struct lyd_node *, enum lyd_diff_op, const struct lyd_node *)"
                     );
      }
      LVar4 = lyd_diff_change_op(plVar7,LYD_DIFF_OP_REPLACE);
      if (LVar4 != LY_SUCCESS) goto LAB_00117e7a;
      plVar8 = plVar7->schema;
      if (plVar8 == (lysc_node *)0x0) {
LAB_001174fb:
        local_68 = (lyd_node *)0x1b746d;
        pcVar15 = "orig-key";
      }
      else {
        local_68 = (lyd_node *)0x1b7774;
        pcVar15 = "orig-position";
        if (plVar8->nodetype == 8) {
          if ((plVar8->flags & 1) != 0) goto LAB_001174fb;
        }
        else if ((plVar8->nodetype != 0x10) || ((plVar8->flags & 0x200) == 0)) goto LAB_001174fb;
      }
      plVar12 = lyd_find_meta(plVar10->meta,plVar11,pcVar15);
      if (plVar12 != (lyd_meta *)0x0) {
        LVar4 = lyd_dup_meta_single(plVar12,plVar7,(lyd_meta **)0x0);
        if (LVar4 != LY_SUCCESS) goto LAB_00117e7a;
        plVar12 = lyd_find_meta(plVar10->meta,plVar11,(char *)local_68);
        plVar10 = local_78;
        if (plVar12 != (lyd_meta *)0x0) {
          LVar4 = lyd_dup_meta_single(plVar12,plVar7,(lyd_meta **)0x0);
          plVar10 = local_78;
          goto joined_r0x00117603;
        }
        pcVar21 = lyd_path(local_78,LYD_PATH_STD,(char *)0x0,0);
        pcVar14 = "Failed to find metadata \"%s\" for node \"%s\".";
        plVar18 = local_70;
        pcVar15 = (char *)local_68;
        plVar9 = (lyd_node *)pcVar21;
        break;
      }
    }
    pcVar21 = lyd_path(plVar10,LYD_PATH_STD,(char *)0x0,0);
    pcVar14 = "Failed to find metadata \"%s\" for node \"%s\".";
    plVar18 = local_70;
    plVar9 = (lyd_node *)pcVar21;
    break;
  case LYD_DIFF_OP_NONE:
    uVar13 = plVar10->schema->nodetype;
    if ((uVar13 == 0x10) && ((plVar10->schema->flags & 0x200) != 0)) {
      __assert_fail("(src_diff->schema->nodetype != LYS_LIST) || !lysc_is_dup_inst_list(src_diff->schema)"
                    ,"/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                    ,0x7cb,
                    "LY_ERR lyd_diff_merge_r(const struct lyd_node *, struct lyd_node *, lyd_diff_cb, void *, struct ly_ht **, uint16_t, struct lyd_node **)"
                   );
    }
    if ((cur_op < 4) && (cur_op != LYD_DIFF_OP_DELETE)) {
      if ((uVar13 & 0xc) != 0) {
LAB_00117163:
        uVar5 = plVar7->flags & 0xfffffffe;
        plVar7->flags = uVar5;
        plVar7->flags = plVar10->flags & 1 | uVar5;
      }
      goto LAB_00117e89;
    }
    plVar9 = (lyd_node *)lyd_path(diff_node,LYD_PATH_STD,(char *)0x0,0);
    if (plVar7->schema == (lysc_node *)0x0) {
      plVar11 = (lys_module *)&plVar7[2].schema;
    }
    else {
      plVar11 = plVar7->schema->module;
    }
    plVar18 = plVar11->ctx;
    pcVar21 = lyd_diff_op2str(cur_op);
    pcVar14 = "Unable to merge operation \"%s\" with \"%s\" for node \"%s\".";
    pcVar15 = "none";
    break;
  default:
    if (plVar10->schema == (lysc_node *)0x0) {
      plVar11 = (lys_module *)&plVar10[2].schema;
    }
    else {
      plVar11 = plVar10->schema->module;
    }
    ly_log(plVar11->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",1999);
    return LY_EINT;
  }
  LVar4 = LY_EINVAL;
  ly_log(plVar18,LY_LLERR,LY_EINVAL,pcVar14,pcVar15,pcVar21);
  free(plVar9);
LAB_00117e7a:
  if (plVar10->schema == (lysc_node *)0x0) {
    plVar11 = (lys_module *)&plVar10[2].schema;
  }
  else {
    plVar11 = plVar10->schema->module;
  }
  plVar18 = plVar11->ctx;
  pcVar15 = lyd_diff_op2str(src_op);
  ly_log(plVar18,LY_LLERR,LY_EOTHER,"Merging operation \"%s\" failed.",pcVar15);
  return LVar4;
}

Assistant:

static LY_ERR
lyd_diff_merge_r(const struct lyd_node *src_diff, struct lyd_node *diff_parent, lyd_diff_cb diff_cb, void *cb_data,
        struct ly_ht **dup_inst, uint16_t options, struct lyd_node **diff)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyd_node *child, *diff_node = NULL;
    enum lyd_diff_op src_op, cur_op;
    struct ly_ht *child_dup_inst = NULL;

    /* get source node operation */
    LY_CHECK_RET(lyd_diff_get_op(src_diff, &src_op));

    /* find an equal node in the current diff */
    LY_CHECK_RET(lyd_diff_find_match(diff_parent ? lyd_child_no_keys(diff_parent) : *diff, src_diff, 1, dup_inst, &diff_node));

    if (diff_node) {
        /* get target (current) operation */
        LY_CHECK_RET(lyd_diff_get_op(diff_node, &cur_op));

        /* merge operations */
        switch (src_op) {
        case LYD_DIFF_OP_REPLACE:
            ret = lyd_diff_merge_replace(diff_node, cur_op, src_diff);
            break;
        case LYD_DIFF_OP_CREATE:
            if ((cur_op == LYD_DIFF_OP_CREATE) && lysc_is_dup_inst_list(diff_node->schema)) {
                /* special case of creating duplicate (leaf-)list instances */
                goto add_diff;
            }

            ret = lyd_diff_merge_create(&diff_node, diff, cur_op, src_diff, options);
            break;
        case LYD_DIFF_OP_DELETE:
            ret = lyd_diff_merge_delete(diff_node, cur_op, src_diff);
            break;
        case LYD_DIFF_OP_NONE:
            /* key-less list can never have "none" operation since all its descendants are acting as "keys" */
            assert((src_diff->schema->nodetype != LYS_LIST) || !lysc_is_dup_inst_list(src_diff->schema));
            ret = lyd_diff_merge_none(diff_node, cur_op, src_diff);
            break;
        default:
            LOGINT_RET(LYD_CTX(src_diff));
        }
        if (ret) {
            LOGERR(LYD_CTX(src_diff), LY_EOTHER, "Merging operation \"%s\" failed.", lyd_diff_op2str(src_op));
            return ret;
        }

        if (diff_cb) {
            /* call callback */
            LY_CHECK_RET(diff_cb(src_diff, diff_node, cb_data));
        }

        /* update diff parent */
        diff_parent = diff_node;

        /* for diff purposes, all key-less list descendants actually act as keys (identifying the same instances),
         * so there is nothing to merge for these "keys" */
        if (!lysc_is_dup_inst_list(src_diff->schema)) {
            /* merge src_diff recursively */
            LY_LIST_FOR(lyd_child_no_keys(src_diff), child) {
                ret = lyd_diff_merge_r(child, diff_parent, diff_cb, cb_data, &child_dup_inst, options, diff);
                if (ret) {
                    break;
                }
            }
            lyd_dup_inst_free(child_dup_inst);
            LY_CHECK_RET(ret);
        }
    } else {
add_diff:
        /* add new diff node with all descendants */
        if ((src_diff->flags & LYD_EXT) && diff_parent) {
            LY_CHECK_RET(lyd_dup_single_to_ctx(src_diff, LYD_CTX(diff_parent), (struct lyd_node_inner *)diff_parent,
                    LYD_DUP_RECURSIVE | LYD_DUP_WITH_FLAGS | LYD_DUP_NO_LYDS, &diff_node));
        } else {
            LY_CHECK_RET(lyd_dup_single(src_diff, (struct lyd_node_inner *)diff_parent,
                    LYD_DUP_RECURSIVE | LYD_DUP_WITH_FLAGS | LYD_DUP_NO_LYDS, &diff_node));
        }

        /* insert node into diff if not already */
        if (!diff_parent) {
            lyd_diff_insert_sibling(*diff, diff_node, diff);
        }

        /* update operation */
        LY_CHECK_RET(lyd_diff_change_op(diff_node, src_op));

        if (diff_cb) {
            /* call callback with no source diff node since it was duplicated and just added */
            LY_CHECK_RET(diff_cb(NULL, diff_node, cb_data));
        }

        /* update diff parent */
        diff_parent = diff_node;
    }

    /* remove any redundant nodes */
    if (lyd_diff_is_redundant(diff_parent)) {
        if (diff_parent == *diff) {
            *diff = (*diff)->next;
        }
        lyd_free_tree(diff_parent);
    }

    return LY_SUCCESS;
}